

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::ProcessByteCodeUsesInstr(BackwardPass *this,Instr *instr)

{
  Phase PVar1;
  int iVar2;
  Type TVar3;
  long lVar4;
  code *pcVar5;
  RegSlot RVar6;
  ByteCodeUsesInstr *byteCodeUsesInstr;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  undefined4 *puVar8;
  StackSym *pSVar9;
  Func *pFVar10;
  StackSym **ppSVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  BVUnitT<unsigned_long> local_50;
  SparseBVUnit _unit;
  
  bVar13 = instr->m_kind == InstrKindByteCodeUses;
  bVar14 = instr->m_opcode == ByteCodeUses;
  bVar12 = bVar14 && bVar13;
  if (!bVar14 || !bVar13) {
    return bVar12;
  }
  byteCodeUsesInstr = IR::Instr::AsByteCodeUsesInstr(instr);
  PVar1 = this->tag;
  if (PVar1 == CaptureByteCodeRegUsePhase) {
    ProcessByteCodeUsesDst(this,byteCodeUsesInstr);
    ProcessByteCodeUsesSrcs(this,byteCodeUsesInstr);
    return bVar12;
  }
  if (PVar1 != DeadStorePhase) {
    if (PVar1 == BackwardPhase) {
      pBVar7 = ProcessByteCodeUsesSrcs(this,byteCodeUsesInstr);
      if (pBVar7 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return bVar12;
      }
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->currentBlock->upwardExposedUses,pBVar7);
      return bVar12;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x815,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar13) goto LAB_003c7a34;
    *puVar8 = 0;
  }
  if (instr->m_opcode != ByteCodeUses) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x816,"(instr->m_opcode == Js::OpCode::ByteCodeUses)",
                        "instr->m_opcode == Js::OpCode::ByteCodeUses");
    if (!bVar13) {
LAB_003c7a34:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  bVar13 = DoMarkTempObjectVerify(this);
  if ((bVar13) &&
     (((this->currentBlock->field_0x18 & 2) != 0 || ((this->func->field_0x240 & 0x10) == 0)))) {
    if (this->isCollectionPass == true) {
      if ((this->func->field_0x240 & 0x10) == 0) {
        return bVar12;
      }
    }
    else {
      ObjectTempVerify::NotifyDeadByteCodeUses
                (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr);
    }
  }
  if ((this->func->field_0x240 & 0x10) != 0) {
    pSVar9 = ProcessByteCodeUsesDst(this,byteCodeUsesInstr);
    if ((pSVar9 != (StackSym *)0x0) &&
       (pFVar10 = StackSym::GetByteCodeFunc(pSVar9), pFVar10 == this->func)) {
      ppSVar11 = this->currentBlock->byteCodeRestoreSyms;
      RVar6 = StackSym::GetByteCodeRegSlot(pSVar9);
      ppSVar11[RVar6] = (StackSym *)0x0;
    }
    pBVar7 = ProcessByteCodeUsesSrcs(this,byteCodeUsesInstr);
    if (pBVar7 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      _unit.word = (Type)pBVar7;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while (TVar3 = *_unit.word, TVar3 != 0) {
        iVar2 = *(int *)(TVar3 + 8);
        local_50.word = *(ulong *)(TVar3 + 0x10);
        _unit.word = TVar3;
        while (local_50.word != 0) {
          lVar4 = 0;
          if (local_50.word != 0) {
            for (; (local_50.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear(&local_50,(BVIndex)lVar4);
          pSVar9 = SymTable::FindStackSym(this->func->m_symTable,iVar2 + (BVIndex)lVar4);
          if ((pSVar9->field_0x1a & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                ,0x83e,"(!stackSym->IsTypeSpec())","!stackSym->IsTypeSpec()");
            if (!bVar13) goto LAB_003c7a34;
            *puVar8 = 0;
          }
          pFVar10 = StackSym::GetByteCodeFunc(pSVar9);
          if (pFVar10 == this->func) {
            RVar6 = StackSym::GetByteCodeRegSlot(pSVar9);
            if (RVar6 == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                  ,0x843,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                                  "byteCodeRegSlot != Js::Constants::NoRegister");
              if (!bVar13) goto LAB_003c7a34;
              *puVar8 = 0;
            }
            ppSVar11 = this->currentBlock->byteCodeRestoreSyms;
            if (ppSVar11[RVar6] != pSVar9) {
              if (ppSVar11[RVar6] != (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                    ,0x847,
                                    "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                    ,
                                    "Can\'t have two active lifetime for the same byte code register"
                                   );
                if (!bVar13) goto LAB_003c7a34;
                *puVar8 = 0;
                ppSVar11 = this->currentBlock->byteCodeRestoreSyms;
              }
              ppSVar11[RVar6] = pSVar9;
            }
          }
        }
      }
    }
    if (this->isCollectionPass != false) {
      return bVar12;
    }
    if ((byteCodeUsesInstr->propertySymUse != (PropertySym *)0x0) &&
       ((this->currentBlock->field_0x18 & 2) == 0)) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->upwardExposedFields,
                 (byteCodeUsesInstr->propertySymUse->super_Sym).m_id);
    }
    if (this->currentPrePassLoop != (Loop *)0x0) {
      return bVar12;
    }
  }
  BasicBlock::RemoveInstr(this->currentBlock,instr);
  return bVar12;
}

Assistant:

bool
BackwardPass::ProcessByteCodeUsesInstr(IR::Instr * instr)
{
    if (!instr->IsByteCodeUsesInstr())
    {
        return false;
    }

    IR::ByteCodeUsesInstr * byteCodeUsesInstr = instr->AsByteCodeUsesInstr();

    if (this->tag == Js::BackwardPhase)
    {
        // FGPeeps inserts bytecodeuses instrs with srcs.  We need to look at them to set the proper
        // UpwardExposedUsed info and keep the defs alive.
        // The inliner inserts bytecodeuses instrs withs dsts, but we don't want to look at them for upwardExposedUsed
        // as it would cause real defs to look dead.  We use these for bytecodeUpwardExposedUsed info only, which is needed
        // in the dead-store pass only.
        //
        // Handle the source side.
        const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
        if (byteCodeUpwardExposedUsed != nullptr)
        {
            this->currentBlock->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
        }
    }
#if DBG
    else if (tag == Js::CaptureByteCodeRegUsePhase)
    {
        ProcessByteCodeUsesDst(byteCodeUsesInstr);
        ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
    }
#endif
    else
    {
        Assert(tag == Js::DeadStorePhase);
        Assert(instr->m_opcode == Js::OpCode::ByteCodeUses);
#if DBG
        if (this->DoMarkTempObjectVerify() && (this->currentBlock->isDead || !this->func->hasBailout))
        {
            if (IsCollectionPass())
            {
                if (!this->func->hasBailout)
                {
                    // Prevent byte code uses from being remove on collection pass for mark temp object verify
                    // if we don't have any bailout
                    return true;
                }
            }
            else
            {
                this->currentBlock->tempObjectVerifyTracker->NotifyDeadByteCodeUses(instr);
            }
        }
#endif

        if (this->func->hasBailout)
        {
            // Just collect the byte code uses, and remove the instruction
            // We are going backward, process the dst first and then the src
            StackSym *dstStackSym = ProcessByteCodeUsesDst(byteCodeUsesInstr);
#if DBG
            // We can only track first level function stack syms right now
            if (dstStackSym && dstStackSym->GetByteCodeFunc() == this->func)
            {
                this->currentBlock->byteCodeRestoreSyms[dstStackSym->GetByteCodeRegSlot()] = nullptr;
            }
#endif

            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
#if DBG
            if (byteCodeUpwardExposedUsed)
            {
                FOREACH_BITSET_IN_SPARSEBV(symId, byteCodeUpwardExposedUsed)
                {
                    StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                    Assert(!stackSym->IsTypeSpec());
                    // We can only track first level function stack syms right now
                    if (stackSym->GetByteCodeFunc() == this->func)
                    {
                        Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                        Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                        if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                        {
                            AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                                "Can't have two active lifetime for the same byte code register");
                            this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                        }
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;
            }
#endif

            if (IsCollectionPass())
            {
                return true;
            }

            PropertySym *propertySymUse = byteCodeUsesInstr->propertySymUse;
            if (propertySymUse && !this->currentBlock->isDead)
            {
                this->currentBlock->upwardExposedFields->Set(propertySymUse->m_id);
            }

            if (this->IsPrePass())
            {
                // Don't remove the instruction yet if we are in the prepass
                // But tell the caller we don't need to process the instruction any more
                return true;
            }
        }

        this->currentBlock->RemoveInstr(instr);
    }